

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdrawutil.cpp
# Opt level: O1

void qDrawShadePanel(QPainter *p,int x,int y,int w,int h,QPalette *pal,bool sunken,int lineWidth,
                    QBrush *fill)

{
  undefined8 uVar1;
  undefined8 uVar2;
  uint uVar3;
  char cVar4;
  long *plVar5;
  int iVar6;
  int iVar7;
  ColorGroup CVar8;
  int iVar9;
  uint uVar10;
  long in_FS_OFFSET;
  ulong uVar11;
  double dVar12;
  double dVar13;
  int iVar15;
  undefined4 uVar16;
  undefined1 auVar14 [16];
  undefined4 uVar17;
  double dVar18;
  int local_f8;
  int iStack_f4;
  int local_c8;
  int iStack_c4;
  QLineF local_98;
  QList<QLineF> local_78;
  QColor local_58;
  QColor local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (h != 0 && w != 0) {
    if ((h | w | lineWidth) < 0) {
      qDrawShadePanel();
    }
    QPainter::save();
    QPainter::device();
    dVar12 = (double)QPaintDevice::devicePixelRatio();
    dVar13 = dVar12 + -1.0;
    uVar11 = -(ulong)(dVar13 < -dVar13);
    dVar13 = (double)(~uVar11 & (ulong)dVar13 | (ulong)-dVar13 & uVar11) * 1000000000000.0;
    uVar11 = -(ulong)(dVar12 < -dVar12);
    dVar18 = (double)(~uVar11 & (ulong)dVar12 | (ulong)-dVar12 & uVar11);
    if (1.0 <= dVar18) {
      dVar18 = 1.0;
    }
    local_f8 = x;
    iStack_f4 = y;
    local_c8 = w;
    iStack_c4 = h;
    if (dVar18 < dVar13) {
      QPainter::scale(1.0 / dVar12,1.0 / dVar12);
      local_f8 = (int)((double)((ulong)((double)x * dVar12) & 0x8000000000000000 |
                               0x3fe0000000000000) + (double)x * dVar12);
      iStack_f4 = (int)((double)((ulong)((double)y * dVar12) & 0x8000000000000000 |
                                0x3fe0000000000000) + (double)y * dVar12);
      local_c8 = (int)((double)w * dVar12);
      iStack_c4 = (int)((double)h * dVar12);
      lineWidth = (int)((double)((ulong)((double)lineWidth * dVar12) & 0x8000000000000000 |
                                0x3fe0000000000000) + (double)lineWidth * dVar12);
      local_98.pt1.xp = 0.5;
      local_98.pt1.yp = 0.5;
      QPainter::translate((QPointF *)p);
    }
    local_48._0_6_ = 0xaaaaaaaaaaaa;
    local_48.ct.argb.red = 0xaaaa;
    local_48.ct._4_6_ = 0xaaaaaaaaaaaa;
    local_48._14_2_ = 0xaaaa;
    CVar8 = (ColorGroup)pal;
    plVar5 = (long *)QPalette::brush(CVar8,Dark);
    uVar1 = *(undefined8 *)(*plVar5 + 8);
    uVar2 = *(undefined8 *)(*plVar5 + 0x10);
    local_48._0_6_ = SUB86(uVar1,0);
    local_48.ct.argb.red = (ushort)((ulong)uVar1 >> 0x30);
    local_48.ct._4_6_ = (undefined6)uVar2;
    local_48._14_2_ = SUB82((ulong)uVar2 >> 0x30,0);
    local_58._0_6_ = 0xaaaaaaaaaaaa;
    local_58.ct.argb.red = 0xaaaa;
    local_58.ct._4_6_ = 0xaaaaaaaaaaaa;
    local_58._14_2_ = 0xaaaa;
    plVar5 = (long *)QPalette::brush(CVar8,Dark);
    uVar1 = *(undefined8 *)(*plVar5 + 8);
    uVar2 = *(undefined8 *)(*plVar5 + 0x10);
    local_58._0_6_ = SUB86(uVar1,0);
    local_58.ct.argb.red = (ushort)((ulong)uVar1 >> 0x30);
    local_58.ct._4_6_ = (undefined6)uVar2;
    local_58._14_2_ = SUB82((ulong)uVar2 >> 0x30,0);
    if (fill != (QBrush *)0x0) {
      cVar4 = QColor::operator==((QColor *)(*(long *)fill + 8),&local_48);
      if (cVar4 != '\0') {
        plVar5 = (long *)QPalette::brush(CVar8,Dark);
        uVar1 = *(undefined8 *)(*plVar5 + 0xe);
        local_48._0_6_ = SUB86(*(undefined8 *)(*plVar5 + 8),0);
        local_48.ct.argb.red = (ushort)uVar1;
        local_48.ct._4_6_ = (undefined6)((ulong)uVar1 >> 0x10);
      }
      cVar4 = QColor::operator==((QColor *)(*(long *)fill + 8),&local_58);
      if (cVar4 != '\0') {
        plVar5 = (long *)QPalette::brush(CVar8,Dark);
        uVar1 = *(undefined8 *)(*plVar5 + 0xe);
        local_58._0_6_ = SUB86(*(undefined8 *)(*plVar5 + 8),0);
        local_58.ct.argb.red = (ushort)uVar1;
        local_58.ct._4_6_ = (undefined6)((ulong)uVar1 >> 0x10);
      }
    }
    local_78.d.d = (Data *)0x0;
    local_78.d.ptr = (QLineF *)0x0;
    local_78.d.size = 0;
    uVar3 = lineWidth * 2;
    QList<QLineF>::reserve(&local_78,(long)(int)uVar3);
    QPainter::setPen((QColor *)p);
    iVar15 = iStack_f4 + iStack_c4;
    iVar6 = iStack_f4;
    if (0 < lineWidth) {
      iVar9 = local_f8 + local_c8 + -2;
      uVar10 = lineWidth;
      do {
        local_98.pt1.yp = (qreal)iVar6;
        iVar6 = iVar6 + 1;
        local_98.pt2.xp = (qreal)iVar9;
        iVar9 = iVar9 + -1;
        local_98.pt1.xp = (double)local_f8;
        local_98.pt2.yp = local_98.pt1.yp;
        QtPrivate::QPodArrayOps<QLineF>::emplace<QLineF>
                  ((QPodArrayOps<QLineF> *)&local_78,local_78.d.size,&local_98);
        QList<QLineF>::end(&local_78);
        uVar10 = uVar10 - 1;
      } while (uVar10 != 0);
    }
    if (0 < lineWidth) {
      iVar9 = local_f8;
      uVar10 = lineWidth;
      do {
        local_98.pt1.xp = (qreal)iVar9;
        local_98.pt2.xp = (qreal)iVar9;
        local_98.pt2.yp = (qreal)iVar6;
        iVar9 = iVar9 + 1;
        iVar6 = iVar6 + -1;
        local_98.pt1.yp = (double)(iVar15 + -2);
        QtPrivate::QPodArrayOps<QLineF>::emplace<QLineF>
                  ((QPodArrayOps<QLineF> *)&local_78,local_78.d.size,&local_98);
        QList<QLineF>::end(&local_78);
        uVar10 = uVar10 - 1;
      } while (uVar10 != 0);
    }
    QPainter::drawLines((QLineF *)p,(int)local_78.d.ptr);
    QList<QLineF>::clear(&local_78);
    QPainter::setPen((QColor *)p);
    iVar6 = local_f8 + local_c8 + -1;
    if (0 < lineWidth) {
      iVar7 = local_f8;
      iVar9 = iVar15;
      uVar10 = lineWidth;
      do {
        iVar9 = iVar9 + -1;
        local_98.pt1.xp = (qreal)iVar7;
        iVar7 = iVar7 + 1;
        local_98.pt1.yp = (qreal)iVar9;
        local_98.pt2.xp = (double)iVar6;
        local_98.pt2.yp = local_98.pt1.yp;
        QtPrivate::QPodArrayOps<QLineF>::emplace<QLineF>
                  ((QPodArrayOps<QLineF> *)&local_78,local_78.d.size,&local_98);
        QList<QLineF>::end(&local_78);
        uVar10 = uVar10 - 1;
      } while (uVar10 != 0);
    }
    if (0 < lineWidth) {
      auVar14._4_4_ = iStack_f4;
      auVar14._0_4_ = iVar6;
      auVar14._8_8_ = 0;
      uVar10 = lineWidth;
      do {
        iVar6 = auVar14._0_4_;
        local_98.pt1.xp = (qreal)iVar6;
        local_98.pt1.yp = (qreal)auVar14._4_4_;
        uVar16 = auVar14._8_4_;
        uVar17 = auVar14._12_4_;
        local_98.pt2.xp = (qreal)iVar6;
        local_98.pt2.yp = (double)(iVar15 + ~lineWidth);
        QtPrivate::QPodArrayOps<QLineF>::emplace<QLineF>
                  ((QPodArrayOps<QLineF> *)&local_78,local_78.d.size,&local_98);
        QList<QLineF>::end(&local_78);
        auVar14._4_4_ = auVar14._4_4_ + 1;
        auVar14._0_4_ = iVar6 + -1;
        auVar14._8_4_ = uVar16;
        auVar14._12_4_ = uVar17;
        uVar10 = uVar10 - 1;
      } while (uVar10 != 0);
    }
    QPainter::drawLines((QLineF *)p,(int)local_78.d.ptr);
    if (fill != (QBrush *)0x0) {
      if (dVar18 < dVar13) {
        local_98.pt1.xp = -0.5;
        local_98.pt1.yp = -0.5;
        QPainter::translate((QPointF *)p);
      }
      local_98.pt1.xp = (qreal)CONCAT44(iStack_f4 + lineWidth,local_f8 + lineWidth);
      local_98.pt1.yp =
           (qreal)CONCAT44(iStack_c4 + (uVar3 ^ 0xffffffff) + iStack_f4 + lineWidth,
                           local_c8 + (uVar3 ^ 0xffffffff) + local_f8 + lineWidth);
      QPainter::fillRect((QRect *)p,(QBrush *)&local_98);
    }
    if (&(local_78.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_78.d.d)->super_QArrayData,0x20,0x10);
      }
    }
    QPainter::restore();
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void qDrawShadePanel(QPainter *p, int x, int y, int w, int h,
                      const QPalette &pal, bool sunken,
                      int lineWidth, const QBrush *fill)
{
    if (w == 0 || h == 0)
        return;
    if (Q_UNLIKELY(w < 0 || h < 0 || lineWidth < 0)) {
        qWarning("qDrawShadePanel: Invalid parameters");
    }

    QPainterStateGuard painterGuard(p);
    const qreal devicePixelRatio = QStyleHelper::getDpr(p);
    bool isTranslated = false;
    if (!qFuzzyCompare(devicePixelRatio, qreal(1))) {
        const qreal inverseScale = qreal(1) / devicePixelRatio;
        p->scale(inverseScale, inverseScale);
        x = qRound(devicePixelRatio * x);
        y = qRound(devicePixelRatio * y);
        w = devicePixelRatio * w;
        h = devicePixelRatio * h;
        lineWidth = qRound(devicePixelRatio * lineWidth);
        p->translate(0.5, 0.5);
        isTranslated = true;
    }

    QColor shade = pal.dark().color();
    QColor light = pal.light().color();
    if (fill) {
        if (fill->color() == shade)
            shade = pal.shadow().color();
        if (fill->color() == light)
            light = pal.midlight().color();
    }
    QList<QLineF> lines;
    lines.reserve(2*lineWidth);

    if (sunken)
        p->setPen(shade);
    else
        p->setPen(light);
    int x1, y1, x2, y2;
    int i;
    x1 = x;
    y1 = y2 = y;
    x2 = x+w-2;
    for (i=0; i<lineWidth; i++) {                // top shadow
        lines << QLineF(x1, y1++, x2--, y2++);
    }
    x2 = x1;
    y1 = y+h-2;
    for (i=0; i<lineWidth; i++) {                // left shado
        lines << QLineF(x1++, y1, x2++, y2--);
    }
    p->drawLines(lines);
    lines.clear();
    if (sunken)
        p->setPen(light);
    else
        p->setPen(shade);
    x1 = x;
    y1 = y2 = y+h-1;
    x2 = x+w-1;
    for (i=0; i<lineWidth; i++) {                // bottom shadow
        lines << QLineF(x1++, y1--, x2, y2--);
    }
    x1 = x2;
    y1 = y;
    y2 = y+h-lineWidth-1;
    for (i=0; i<lineWidth; i++) {                // right shadow
        lines << QLineF(x1--, y1++, x2--, y2);
    }
    p->drawLines(lines);
    if (fill) {                                // fill with fill color
        if (isTranslated)
            p->translate(-0.5, -0.5);
        p->fillRect(x+lineWidth, y+lineWidth, w-lineWidth*2, h-lineWidth*2, *fill);
    }
}